

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall el::Logger::resolveLoggerFormatSpec(Logger *this)

{
  EnumType lIndex;
  EnumType local_2a;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &local_2a;
  local_2a = 2;
  local_10 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ifraud[P]LirePlusPlus/utils/easylogging++.h:3593:44)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  LevelHelper::forEachLevel((EnumType *)local_28._8_8_,(function<bool_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void resolveLoggerFormatSpec(void) const {
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            base::LogFormat* logFormat = 
                const_cast<base::LogFormat*>(&m_typedConfigurations->logFormat(LevelHelper::castFromInt(lIndex)));
            base::utils::Str::replaceFirstWithEscape(logFormat->m_format, base::consts::kLoggerIdFormatSpecifier, m_id);
            return false;
        });
    }